

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetApproxQuantileListAggregateFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  NotImplementedException *pNVar2;
  LogicalType *in_RDX;
  allocator local_39;
  string local_38;
  
  switch(type->id_) {
  case TINYINT:
    GetTypedApproxQuantileListAggregateFunction<signed_char,signed_char>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INTEGER:
  case DATE:
  case TIME:
switchD_01cb962c_caseD_d:
    GetTypedApproxQuantileListAggregateFunction<int,int>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case BIGINT:
  case TIMESTAMP:
  case TIMESTAMP_TZ:
switchD_01cb962c_caseD_e:
    GetTypedApproxQuantileListAggregateFunction<long,long>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP_NS:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
  case UTINYINT:
  case USMALLINT:
  case UINTEGER:
  case UBIGINT:
  case TIMESTAMP_TZ|SQLNULL:
switchD_01cb962c_caseD_11:
    pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unimplemented approximate quantile list aggregate",&local_39);
    NotImplementedException::NotImplementedException(pNVar2,&local_38);
    __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    PVar1 = type->physical_type_;
    if (PVar1 == INT128) goto LAB_01cb96ec;
    if (PVar1 == INT32) goto switchD_01cb962c_caseD_d;
    if (PVar1 == INT64) goto switchD_01cb962c_caseD_e;
    if (PVar1 != INT16) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unimplemented approximate quantile list decimal aggregate",
                 &local_39);
      NotImplementedException::NotImplementedException(pNVar2,&local_38);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  case SMALLINT:
    GetTypedApproxQuantileListAggregateFunction<short,short>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case FLOAT:
    GetTypedApproxQuantileListAggregateFunction<float,float>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case DOUBLE:
    GetTypedApproxQuantileListAggregateFunction<double,double>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case TIME_TZ:
    GetTypedApproxQuantileListAggregateFunction<duckdb::dtime_tz_t,duckdb::dtime_tz_t>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  default:
    if (type->id_ != HUGEINT) goto switchD_01cb962c_caseD_11;
LAB_01cb96ec:
    GetTypedApproxQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetApproxQuantileListAggregateFunction(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
		return GetTypedApproxQuantileListAggregateFunction<int8_t, int8_t>(type);
	case LogicalTypeId::SMALLINT:
		return GetTypedApproxQuantileListAggregateFunction<int16_t, int16_t>(type);
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
	case LogicalTypeId::TIME:
		return GetTypedApproxQuantileListAggregateFunction<int32_t, int32_t>(type);
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		return GetTypedApproxQuantileListAggregateFunction<int64_t, int64_t>(type);
	case LogicalTypeId::TIME_TZ:
		//	Not binary comparable
		return GetTypedApproxQuantileListAggregateFunction<dtime_tz_t, dtime_tz_t>(type);
	case LogicalTypeId::HUGEINT:
		return GetTypedApproxQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
	case LogicalTypeId::FLOAT:
		return GetTypedApproxQuantileListAggregateFunction<float, float>(type);
	case LogicalTypeId::DOUBLE:
		return GetTypedApproxQuantileListAggregateFunction<double, double>(type);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return GetTypedApproxQuantileListAggregateFunction<int16_t, int16_t>(type);
		case PhysicalType::INT32:
			return GetTypedApproxQuantileListAggregateFunction<int32_t, int32_t>(type);
		case PhysicalType::INT64:
			return GetTypedApproxQuantileListAggregateFunction<int64_t, int64_t>(type);
		case PhysicalType::INT128:
			return GetTypedApproxQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
		default:
			throw NotImplementedException("Unimplemented approximate quantile list decimal aggregate");
		}
	default:
		throw NotImplementedException("Unimplemented approximate quantile list aggregate");
	}
}